

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderBuiltinConstantTests.cpp
# Opt level: O2

int deqp::gles31::Functional::anon_unknown_1::getInteger(Functions *gl,deUint32 pname)

{
  uint in_EAX;
  GLenum err;
  int v;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  (*gl->getIntegerv)(0x8d57,(GLint *)((long)&uStack_18 + 4));
  err = (*gl->getError)();
  glu::checkError(err,"glGetIntegerv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderHelperInvocationTests.cpp"
                  ,0x96);
  return uStack_18._4_4_;
}

Assistant:

static int getInteger (const glw::Functions& gl, deUint32 pname)
{
	int value = -1;
	gl.getIntegerv(pname, &value);
	GLU_EXPECT_NO_ERROR(gl.getError(), ("glGetIntegerv(" + glu::getGettableStateStr((int)pname).toString() + ")").c_str());
	return value;
}